

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

ssize_t cab_strnlen(uchar *p,size_t maxlen)

{
  uchar *local_28;
  size_t i;
  size_t maxlen_local;
  uchar *p_local;
  
  for (local_28 = (uchar *)0x0; (local_28 <= maxlen && (p[(long)local_28] != '\0'));
      local_28 = local_28 + 1) {
  }
  if (maxlen < local_28) {
    p_local = (uchar *)0xffffffffffffffff;
  }
  else {
    p_local = local_28;
  }
  return (ssize_t)p_local;
}

Assistant:

static ssize_t
cab_strnlen(const unsigned char *p, size_t maxlen)
{
	size_t i;

	for (i = 0; i <= maxlen; i++) {
		if (p[i] == 0)
			break;
	}
	if (i > maxlen)
		return (-1);/* invalid */
	return ((ssize_t)i);
}